

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

int cm_zlib_gzbuffer(gzFile file,uint size)

{
  gz_statep state;
  uint size_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -1;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if ((int)file[1].pos == 0) {
      if (size << 1 < size) {
        file_local._4_4_ = -1;
      }
      else {
        state._4_4_ = size;
        if (size < 8) {
          state._4_4_ = 8;
        }
        *(uint *)((long)&file[1].pos + 4) = state._4_4_;
        file_local._4_4_ = 0;
      }
    }
    else {
      file_local._4_4_ = -1;
    }
  }
  else {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzbuffer(gzFile file, unsigned size) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* make sure we haven't already allocated memory */
    if (state->size != 0)
        return -1;

    /* check and set requested size */
    if ((size << 1) < size)
        return -1;              /* need to be able to double it */
    if (size < 8)
        size = 8;               /* needed to behave well with flushing */
    state->want = size;
    return 0;
}